

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  char *pcVar1;
  reference pvVar2;
  int in_ECX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  int in_stack_00000008;
  Mat *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  int k_3;
  char *va_3;
  char *vb_3;
  int sum_1;
  int n_5;
  int n_4;
  int n_3;
  int k_2;
  int sum [4];
  char *va_2;
  char *vb_2;
  int j_2;
  float scale_requant_out0_1;
  float scale_requant_in0_1;
  float bias0_1;
  char *output;
  int i_4;
  int k_1;
  char *va_1;
  char *vb_1;
  int sum3_1;
  int sum2_1;
  int sum1_1;
  int sum0_1;
  int n_2;
  int n_1;
  int n;
  int k;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  int sum0 [4];
  char *va;
  char *vb;
  int j_1;
  float scale_requant_out3;
  float scale_requant_in3;
  float scale_requant_out2;
  float scale_requant_in2;
  float scale_requant_out1;
  float scale_requant_in1;
  float scale_requant_out0;
  float scale_requant_in0;
  float bias3;
  float bias2;
  float bias1;
  float bias0;
  char *output3;
  char *output2;
  char *output1;
  char *output0;
  int i_3;
  int pp_1;
  int remain_outch_start_1;
  int nn_outch_1;
  int q_3;
  char *ktmp_1;
  char *k0_1;
  int p_2;
  int q_2;
  char *ktmp;
  char *k3;
  char *k2;
  char *k1;
  char *k0;
  int p_1;
  int pp;
  int remain_outch_start;
  int nn_outch;
  Mat kernel_tm;
  int q_1;
  char *tmpptr_1;
  char *img0_1;
  int i_2;
  int q;
  char *tmpptr;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int K;
  int N;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int v;
  int u;
  char *input;
  int p;
  int j;
  int i;
  int retID;
  char *ret;
  Mat bottom_im2row;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  int int32_9;
  int int32_8;
  int int32_7;
  int int32_6;
  int int32_5;
  int int32_4;
  int int32_3;
  int int32_2;
  int int32_1;
  int int32;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  size_t in_stack_fffffffffffff5d0;
  undefined8 in_stack_fffffffffffff5d8;
  Mat *in_stack_fffffffffffff5e0;
  char *in_stack_fffffffffffff5f0;
  int _c;
  Mat *in_stack_fffffffffffff5f8;
  float local_9f4;
  float local_9a8;
  float local_9a4;
  float local_9a0;
  float local_99c;
  int local_904;
  Mat local_900;
  char *local_8b8;
  Mat local_8b0;
  char *local_868;
  int local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  int local_848 [6];
  Mat local_830;
  char *local_7e8;
  Mat local_7e0;
  char *local_798;
  int local_790;
  value_type local_78c;
  value_type local_788;
  float local_784;
  Mat local_780;
  char *local_738;
  int local_730;
  int local_72c;
  Mat local_728;
  char *local_6e0;
  Mat local_6d8;
  char *local_690;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668 [4];
  int local_658 [4];
  int local_648 [4];
  int local_638 [4];
  Mat local_628;
  char *local_5e0;
  Mat local_5d8;
  char *local_590;
  int local_584;
  value_type local_580;
  value_type local_57c;
  value_type local_578;
  value_type local_574;
  value_type local_570;
  value_type local_56c;
  value_type local_568;
  value_type local_564;
  float local_560;
  float local_55c;
  float local_558;
  float local_554;
  Mat local_550;
  char *local_508;
  Mat local_500;
  char *local_4b8;
  Mat local_4b0;
  char *local_468;
  Mat local_460;
  char *local_418;
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  Mat local_3f8;
  char *local_3b0;
  char *local_3a8;
  int local_3a0;
  int local_39c;
  Mat local_398;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_2cc;
  Mat local_2c8;
  char *local_280;
  char *local_278;
  int local_270;
  int local_26c;
  Mat local_268;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  Mat local_170;
  char *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  char *local_110;
  Mat local_108;
  float *local_c0;
  char *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_78;
  float local_74;
  char local_6d;
  int local_6c;
  float local_68;
  char local_61;
  int local_60;
  float local_5c;
  char local_55;
  int local_54;
  float local_50;
  char local_49;
  int local_48;
  float local_44;
  char local_3d;
  int local_3c;
  float local_38;
  char local_31;
  int local_30;
  float local_2c;
  char local_25;
  int local_24;
  float local_20;
  char local_19;
  int local_18;
  float local_14;
  char local_d;
  int local_c;
  float local_8;
  char local_1;
  
  local_a0 = *(int *)(in_RDI + 0x2c);
  local_a4 = *(int *)(in_RDI + 0x38);
  local_a8 = *(int *)(in_RSI + 0x2c);
  local_ac = *(int *)(in_RSI + 0x30);
  local_b0 = *(int *)(in_RSI + 0x38);
  local_9c = in_R9D;
  local_98 = in_R8D;
  local_94 = in_ECX;
  local_b8 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_c0 = Mat::operator_cast_to_float_(in_stack_00000010);
  Mat::Mat(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
           (int)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
           (Allocator *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8));
  local_110 = Mat::operator_cast_to_signed_char_(&local_108);
  local_114 = 0;
  for (local_118 = 0; local_118 < local_ac; local_118 = local_118 + 1) {
    for (local_11c = 0; local_11c < local_a8; local_11c = local_11c + 1) {
      for (local_120 = 0; local_120 < local_a4; local_120 = local_120 + 1) {
        Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
        pcVar1 = Mat::operator_cast_to_signed_char_(&local_170);
        Mat::~Mat((Mat *)0x2a4f42);
        for (local_180 = 0; local_180 < local_98; local_180 = local_180 + 1) {
          for (local_184 = 0; local_184 < local_94; local_184 = local_184 + 1) {
            local_188 = local_180 + local_118 * in_stack_00000008;
            local_18c = local_184 + local_11c * local_9c;
            local_190 = local_188 * local_a0 + local_18c;
            local_110[local_114] = pcVar1[local_190];
            local_114 = local_114 + 1;
          }
        }
        local_128 = pcVar1;
      }
    }
  }
  local_194 = local_94 * local_98;
  local_198 = local_a8 * local_ac;
  local_19c = local_a8 * local_ac;
  local_1a0 = local_94 * local_98 * local_a4;
  Mat::Mat(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
           (int)in_stack_fffffffffffff5d8,(int)(in_stack_fffffffffffff5d0 >> 0x20),
           CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),(Allocator *)0x2a516a);
  local_1ec = local_198 >> 2;
  local_1f0 = local_1ec << 2;
  for (local_1f4 = 0; local_1f4 < local_1ec; local_1f4 = local_1f4 + 1) {
    local_1f8 = local_1f4 << 2;
    local_200 = Mat::row<signed_char>(&local_108,local_1f8);
    local_208 = Mat::row<signed_char>(&local_108,local_1f8 + 1);
    local_210 = Mat::row<signed_char>(&local_108,local_1f8 + 2);
    local_218 = Mat::row<signed_char>(&local_108,local_1f8 + 3);
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_268);
    Mat::~Mat((Mat *)0x2a52cb);
    local_220 = pcVar1;
    for (local_26c = 0; local_26c + 1 < local_a4 * local_194; local_26c = local_26c + 2) {
      *local_220 = *local_200;
      local_220[1] = local_200[1];
      local_220[2] = *local_208;
      local_220[3] = local_208[1];
      local_220[4] = *local_210;
      local_220[5] = local_210[1];
      local_220[6] = *local_218;
      local_220[7] = local_218[1];
      local_220 = local_220 + 8;
      local_200 = local_200 + 2;
      local_208 = local_208 + 2;
      local_210 = local_210 + 2;
      local_218 = local_218 + 2;
    }
    for (; local_26c < local_a4 * local_194; local_26c = local_26c + 1) {
      *local_220 = *local_200;
      local_220[1] = *local_208;
      local_220[2] = *local_210;
      local_220[3] = *local_218;
      local_220 = local_220 + 4;
      local_200 = local_200 + 1;
      local_208 = local_208 + 1;
      local_210 = local_210 + 1;
      local_218 = local_218 + 1;
    }
  }
  for (local_270 = local_1f0; local_270 < local_198; local_270 = local_270 + 1) {
    local_278 = Mat::row<signed_char>(&local_108,local_270);
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_2c8);
    Mat::~Mat((Mat *)0x2a55f2);
    local_280 = pcVar1;
    for (local_2cc = 0; local_2cc + 1 < local_a4 * local_194; local_2cc = local_2cc + 2) {
      *local_280 = *local_278;
      local_280[1] = local_278[1];
      local_280 = local_280 + 2;
      local_278 = local_278 + 2;
    }
    for (; local_2cc < local_a4 * local_194; local_2cc = local_2cc + 1) {
      *local_280 = *local_278;
      local_280 = local_280 + 1;
      local_278 = local_278 + 1;
    }
  }
  Mat::Mat(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
           (int)in_stack_fffffffffffff5d8,(int)(in_stack_fffffffffffff5d0 >> 0x20),
           CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),(Allocator *)0x2a5764);
  local_31c = local_b0 >> 2;
  local_320 = local_31c << 2;
  for (local_324 = 0; local_324 < local_31c; local_324 = local_324 + 1) {
    local_328 = local_324 * 4;
    local_330 = local_b8 + local_328 * local_a4 * local_194;
    local_338 = local_b8 + (local_328 + 1) * local_a4 * local_194;
    local_340 = local_b8 + (local_328 + 2) * local_a4 * local_194;
    local_348 = local_b8 + (local_328 + 3) * local_a4 * local_194;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_398);
    Mat::~Mat((Mat *)0x2a58e7);
    local_350 = pcVar1;
    for (local_39c = 0; local_39c + 1 < local_a4 * local_194; local_39c = local_39c + 2) {
      *local_350 = *local_330;
      local_350[1] = local_330[1];
      local_350[2] = *local_338;
      local_350[3] = local_338[1];
      local_350[4] = *local_340;
      local_350[5] = local_340[1];
      local_350[6] = *local_348;
      local_350[7] = local_348[1];
      local_350 = local_350 + 8;
      local_330 = local_330 + 2;
      local_338 = local_338 + 2;
      local_340 = local_340 + 2;
      local_348 = local_348 + 2;
    }
    for (; local_39c < local_a4 * local_194; local_39c = local_39c + 1) {
      *local_350 = *local_330;
      local_350[1] = *local_338;
      local_350[2] = *local_340;
      local_350[3] = *local_348;
      local_350 = local_350 + 4;
      local_330 = local_330 + 1;
      local_338 = local_338 + 1;
      local_340 = local_340 + 1;
      local_348 = local_348 + 1;
    }
  }
  for (local_3a0 = local_320; local_3a0 < local_b0; local_3a0 = local_3a0 + 1) {
    local_3a8 = local_b8 + local_3a0 * local_a4 * local_194;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_3f8);
    Mat::~Mat((Mat *)0x2a5c1e);
    local_3b0 = pcVar1;
    for (local_3fc = 0; local_3fc + 1 < local_a4 * local_194; local_3fc = local_3fc + 2) {
      *local_3b0 = *local_3a8;
      local_3b0[1] = local_3a8[1];
      local_3b0 = local_3b0 + 2;
      local_3a8 = local_3a8 + 2;
    }
    for (; local_3fc < local_a4 * local_194; local_3fc = local_3fc + 1) {
      *local_3b0 = *local_3a8;
      local_3b0 = local_3b0 + 1;
      local_3a8 = local_3a8 + 1;
    }
  }
  local_400 = local_b0 >> 2;
  local_404 = local_400 << 2;
  for (local_408 = 0; local_408 < local_400; local_408 = local_408 + 1) {
    local_40c = local_408 << 2;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_460);
    Mat::~Mat((Mat *)0x2a5df1);
    local_418 = pcVar1;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_4b0);
    Mat::~Mat((Mat *)0x2a5e4b);
    local_468 = pcVar1;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_500);
    Mat::~Mat((Mat *)0x2a5ea6);
    local_4b8 = pcVar1;
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_550);
    Mat::~Mat((Mat *)0x2a5ef9);
    if (local_c0 == (float *)0x0) {
      local_99c = 0.0;
    }
    else {
      local_99c = local_c0[local_40c];
    }
    local_554 = local_99c;
    if (local_c0 == (float *)0x0) {
      local_9a0 = 0.0;
    }
    else {
      local_9a0 = local_c0[local_40c + 1];
    }
    local_558 = local_9a0;
    if (local_c0 == (float *)0x0) {
      local_9a4 = 0.0;
    }
    else {
      local_9a4 = local_c0[local_40c + 2];
    }
    local_55c = local_9a4;
    if (local_c0 == (float *)0x0) {
      local_9a8 = 0.0;
    }
    else {
      local_9a8 = local_c0[local_40c + 3];
    }
    local_560 = local_9a8;
    local_508 = pcVar1;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_40c << 1));
    local_564 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_40c * 2 + 1));
    local_568 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 1) * 2));
    local_56c = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 1) * 2 + 1));
    local_570 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 2) * 2));
    local_574 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 2) * 2 + 1));
    local_578 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 3) * 2));
    local_57c = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)((local_40c + 3) * 2 + 1));
    local_580 = *pvVar2;
    for (local_584 = 0; local_584 + 3 < local_19c; local_584 = local_584 + 4) {
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_5d8);
      Mat::~Mat((Mat *)0x2a620d);
      local_590 = pcVar1;
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_628);
      Mat::~Mat((Mat *)0x2a6267);
      local_5e0 = pcVar1;
      memset(local_638,0,0x10);
      memset(local_648,0,0x10);
      memset(local_658,0,0x10);
      memset(local_668,0,0x10);
      for (local_66c = 0; local_66c + 1 < local_1a0; local_66c = local_66c + 2) {
        for (local_670 = 0; local_670 < 4; local_670 = local_670 + 1) {
          local_638[local_670] =
               (int)*local_5e0 * (int)local_590[local_670 << 1] + local_638[local_670];
          local_638[local_670] =
               (int)local_5e0[1] * (int)local_590[local_670 * 2 + 1] + local_638[local_670];
          local_648[local_670] =
               (int)local_5e0[2] * (int)local_590[local_670 << 1] + local_648[local_670];
          local_648[local_670] =
               (int)local_5e0[3] * (int)local_590[local_670 * 2 + 1] + local_648[local_670];
          local_658[local_670] =
               (int)local_5e0[4] * (int)local_590[local_670 << 1] + local_658[local_670];
          local_658[local_670] =
               (int)local_5e0[5] * (int)local_590[local_670 * 2 + 1] + local_658[local_670];
          local_668[local_670] =
               (int)local_5e0[6] * (int)local_590[local_670 << 1] + local_668[local_670];
          local_668[local_670] =
               (int)local_5e0[7] * (int)local_590[local_670 * 2 + 1] + local_668[local_670];
        }
        local_5e0 = local_5e0 + 8;
        local_590 = local_590 + 8;
      }
      for (; local_66c < local_1a0; local_66c = local_66c + 1) {
        for (local_674 = 0; local_674 < 4; local_674 = local_674 + 1) {
          local_638[local_674] = (int)*local_5e0 * (int)local_590[local_674] + local_638[local_674];
          local_648[local_674] =
               (int)local_5e0[1] * (int)local_590[local_674] + local_648[local_674];
          local_658[local_674] =
               (int)local_5e0[2] * (int)local_590[local_674] + local_658[local_674];
          local_668[local_674] =
               (int)local_5e0[3] * (int)local_590[local_674] + local_668[local_674];
        }
        local_5e0 = local_5e0 + 4;
        local_590 = local_590 + 4;
      }
      for (local_678 = 0; local_678 < 4; local_678 = local_678 + 1) {
        local_8 = ((float)local_638[local_678] * local_564 + local_554) * local_568;
        dVar3 = std::round((double)(ulong)(uint)local_8);
        local_c = (int)SUB84(dVar3,0);
        if (local_c < 0x80) {
          if (local_c < -0x7f) {
            local_1 = -0x7f;
          }
          else {
            local_1 = (char)local_c;
          }
        }
        else {
          local_1 = '\x7f';
        }
        local_418[local_678] = local_1;
        local_14 = ((float)local_648[local_678] * local_56c + local_558) * local_570;
        dVar3 = std::round((double)(ulong)(uint)local_14);
        local_18 = (int)SUB84(dVar3,0);
        if (local_18 < 0x80) {
          if (local_18 < -0x7f) {
            local_d = -0x7f;
          }
          else {
            local_d = (char)local_18;
          }
        }
        else {
          local_d = '\x7f';
        }
        local_468[local_678] = local_d;
        local_20 = ((float)local_658[local_678] * local_574 + local_55c) * local_578;
        dVar3 = std::round((double)(ulong)(uint)local_20);
        local_24 = (int)SUB84(dVar3,0);
        if (local_24 < 0x80) {
          if (local_24 < -0x7f) {
            local_19 = -0x7f;
          }
          else {
            local_19 = (char)local_24;
          }
        }
        else {
          local_19 = '\x7f';
        }
        local_4b8[local_678] = local_19;
        local_2c = ((float)local_668[local_678] * local_57c + local_560) * local_580;
        dVar3 = std::round((double)(ulong)(uint)local_2c);
        local_30 = (int)SUB84(dVar3,0);
        if (local_30 < 0x80) {
          if (local_30 < -0x7f) {
            local_25 = -0x7f;
          }
          else {
            local_25 = (char)local_30;
          }
        }
        else {
          local_25 = '\x7f';
        }
        local_508[local_678] = local_25;
      }
      local_418 = local_418 + 4;
      local_468 = local_468 + 4;
      local_4b8 = local_4b8 + 4;
      local_508 = local_508 + 4;
    }
    for (; local_584 < local_19c; local_584 = local_584 + 1) {
      local_67c = 0;
      local_680 = 0;
      local_684 = 0;
      local_688 = 0;
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_6d8);
      Mat::~Mat((Mat *)0x2a6a72);
      local_690 = pcVar1;
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_728);
      Mat::~Mat((Mat *)0x2a6ac9);
      local_6e0 = pcVar1;
      for (local_72c = 0; local_72c + 1 < local_1a0; local_72c = local_72c + 2) {
        local_67c = (int)local_6e0[1] * (int)local_690[1] +
                    (int)*local_6e0 * (int)*local_690 + local_67c;
        local_680 = (int)local_6e0[3] * (int)local_690[1] +
                    (int)local_6e0[2] * (int)*local_690 + local_680;
        local_684 = (int)local_6e0[5] * (int)local_690[1] +
                    (int)local_6e0[4] * (int)*local_690 + local_684;
        local_688 = (int)local_6e0[7] * (int)local_690[1] +
                    (int)local_6e0[6] * (int)*local_690 + local_688;
        local_6e0 = local_6e0 + 8;
        local_690 = local_690 + 2;
      }
      for (; local_72c < local_1a0; local_72c = local_72c + 1) {
        local_67c = (int)*local_6e0 * (int)*local_690 + local_67c;
        local_680 = (int)local_6e0[1] * (int)*local_690 + local_680;
        local_684 = (int)local_6e0[2] * (int)*local_690 + local_684;
        local_688 = (int)local_6e0[3] * (int)*local_690 + local_688;
        local_6e0 = local_6e0 + 4;
        local_690 = local_690 + 1;
      }
      local_38 = ((float)local_67c * local_564 + local_554) * local_568;
      dVar3 = std::round((double)(ulong)(uint)local_38);
      local_3c = (int)SUB84(dVar3,0);
      if (local_3c < 0x80) {
        if (local_3c < -0x7f) {
          local_31 = -0x7f;
        }
        else {
          local_31 = (char)local_3c;
        }
      }
      else {
        local_31 = '\x7f';
      }
      *local_418 = local_31;
      local_44 = ((float)local_680 * local_56c + local_558) * local_570;
      dVar3 = std::round((double)(ulong)(uint)local_44);
      local_48 = (int)SUB84(dVar3,0);
      if (local_48 < 0x80) {
        if (local_48 < -0x7f) {
          local_3d = -0x7f;
        }
        else {
          local_3d = (char)local_48;
        }
      }
      else {
        local_3d = '\x7f';
      }
      *local_468 = local_3d;
      local_50 = ((float)local_684 * local_574 + local_55c) * local_578;
      dVar3 = std::round((double)(ulong)(uint)local_50);
      local_54 = (int)SUB84(dVar3,0);
      if (local_54 < 0x80) {
        if (local_54 < -0x7f) {
          local_49 = -0x7f;
        }
        else {
          local_49 = (char)local_54;
        }
      }
      else {
        local_49 = '\x7f';
      }
      *local_4b8 = local_49;
      local_5c = ((float)local_688 * local_57c + local_560) * local_580;
      dVar3 = std::round((double)(ulong)(uint)local_5c);
      local_60 = (int)SUB84(dVar3,0);
      if (local_60 < 0x80) {
        if (local_60 < -0x7f) {
          local_55 = -0x7f;
        }
        else {
          local_55 = (char)local_60;
        }
      }
      else {
        local_55 = '\x7f';
      }
      *local_508 = local_55;
      local_418 = local_418 + 1;
      local_468 = local_468 + 1;
      local_4b8 = local_4b8 + 1;
      local_508 = local_508 + 1;
    }
  }
  for (local_730 = local_404; local_730 < local_b0; local_730 = local_730 + 1) {
    Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_780);
    Mat::~Mat((Mat *)0x2a709d);
    if (local_c0 == (float *)0x0) {
      local_9f4 = 0.0;
    }
    else {
      local_9f4 = local_c0[local_730];
    }
    local_784 = local_9f4;
    local_738 = pcVar1;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_730 << 1));
    local_788 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_730 * 2 + 1));
    local_78c = *pvVar2;
    for (local_790 = 0; _c = (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
        local_790 + 3 < local_19c; local_790 = local_790 + 4) {
      Mat::channel(in_stack_fffffffffffff5f8,_c);
      in_stack_fffffffffffff5f8 = &local_7e0;
      pcVar1 = Mat::operator_cast_to_signed_char_(in_stack_fffffffffffff5f8);
      Mat::~Mat((Mat *)0x2a71aa);
      local_798 = pcVar1;
      Mat::channel(in_stack_fffffffffffff5f8,_c);
      in_stack_fffffffffffff5f0 = Mat::operator_cast_to_signed_char_(&local_830);
      Mat::~Mat((Mat *)0x2a720c);
      local_7e8 = in_stack_fffffffffffff5f0;
      memset(local_848,0,0x10);
      for (local_84c = 0; local_84c + 1 < local_1a0; local_84c = local_84c + 2) {
        for (local_850 = 0; local_850 < 4; local_850 = local_850 + 1) {
          local_848[local_850] =
               (int)*local_7e8 * (int)local_798[local_850 << 1] + local_848[local_850];
          local_848[local_850] =
               (int)local_7e8[1] * (int)local_798[local_850 * 2 + 1] + local_848[local_850];
        }
        local_7e8 = local_7e8 + 2;
        local_798 = local_798 + 8;
      }
      for (; local_84c < local_1a0; local_84c = local_84c + 1) {
        for (local_854 = 0; local_854 < 4; local_854 = local_854 + 1) {
          local_848[local_854] = (int)*local_7e8 * (int)local_798[local_854] + local_848[local_854];
        }
        local_7e8 = local_7e8 + 1;
        local_798 = local_798 + 4;
      }
      for (local_858 = 0; local_858 < 4; local_858 = local_858 + 1) {
        local_68 = ((float)local_848[local_858] * local_788 + local_784) * local_78c;
        dVar3 = std::round((double)(ulong)(uint)local_68);
        local_6c = (int)SUB84(dVar3,0);
        if (local_6c < 0x80) {
          if (local_6c < -0x7f) {
            local_61 = -0x7f;
          }
          else {
            local_61 = (char)local_6c;
          }
        }
        else {
          local_61 = '\x7f';
        }
        local_738[local_858] = local_61;
      }
      local_738 = local_738 + 4;
    }
    for (; local_790 < local_19c; local_790 = local_790 + 1) {
      local_85c = 0;
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_8b0);
      Mat::~Mat((Mat *)0x2a7563);
      local_868 = pcVar1;
      Mat::channel(in_stack_fffffffffffff5f8,(int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_900);
      Mat::~Mat((Mat *)0x2a75c5);
      local_8b8 = pcVar1;
      for (local_904 = 0; local_904 < local_1a0; local_904 = local_904 + 1) {
        local_85c = (int)*local_8b8 * (int)*local_868 + local_85c;
        local_8b8 = local_8b8 + 1;
        local_868 = local_868 + 1;
      }
      local_74 = ((float)local_85c * local_788 + local_784) * local_78c;
      dVar3 = std::round((double)(ulong)(uint)local_74);
      local_78 = (int)SUB84(dVar3,0);
      if (local_78 < 0x80) {
        if (local_78 < -0x7f) {
          local_6d = -0x7f;
        }
        else {
          local_6d = (char)local_78;
        }
      }
      else {
        local_6d = '\x7f';
      }
      *local_738 = local_6d;
      local_738 = local_738 + 1;
    }
  }
  Mat::~Mat((Mat *)0x2a7733);
  Mat::~Mat((Mat *)0x2a7740);
  Mat::~Mat((Mat *)0x2a774d);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i + 1);
            signed char* output2 = top_blob.channel(i + 2);
            signed char* output3 = top_blob.channel(i + 3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];
            const float scale_requant_in1 = scale_requant[2 * (i + 1)];
            const float scale_requant_out1 = scale_requant[2 * (i + 1) + 1];
            const float scale_requant_in2 = scale_requant[2 * (i + 2)];
            const float scale_requant_out2 = scale_requant[2 * (i + 2) + 1];
            const float scale_requant_in3 = scale_requant[2 * (i + 3)];
            const float scale_requant_out3 = scale_requant[2 * (i + 3) + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}